

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O3

int ON_String::MapStringOrdinal
              (ON_StringMapOrdinalType map_type,char *string,int element_count,char *mapped_string,
              int mapped_string_capacity)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  uint uVar5;
  
  if (mapped_string_capacity == 0) {
    uVar5 = element_count;
    if (element_count < 0) {
      iVar2 = Length(string);
      uVar5 = 0;
      if (-1 < iVar2) {
        uVar5 = iVar2 + 1;
      }
    }
  }
  else {
    uVar5 = 0;
    if (0 < mapped_string_capacity && mapped_string != (char *)0x0) {
      if (string != mapped_string) {
        *mapped_string = '\0';
      }
      uVar5 = 0;
      if (((-1 < element_count) || (element_count = Length(string), -1 < element_count)) &&
         ((uint)element_count <= (uint)mapped_string_capacity)) {
        pbVar3 = (byte *)(string + (uint)element_count);
        if ((map_type == UpperOrdinal) || (map_type == MinimumOrdinal)) {
          if (element_count != 0) {
            do {
              bVar1 = *string;
              string = (char *)((byte *)string + 1);
              bVar4 = bVar1 - 0x20;
              if (0x19 < (byte)(bVar1 + 0x9f)) {
                bVar4 = bVar1;
              }
              *mapped_string = bVar4;
              mapped_string = (char *)((byte *)mapped_string + 1);
            } while (string < pbVar3);
          }
        }
        else if (map_type == LowerOrdinal) {
          if (element_count != 0) {
            do {
              bVar1 = *string;
              string = (char *)((byte *)string + 1);
              bVar4 = bVar1 | 0x20;
              if (0x19 < (byte)(bVar1 + 0xbf)) {
                bVar4 = bVar1;
              }
              *mapped_string = bVar4;
              mapped_string = (char *)((byte *)mapped_string + 1);
            } while (string < pbVar3);
          }
        }
        else if (element_count != 0) {
          do {
            bVar1 = *string;
            string = (char *)((byte *)string + 1);
            *mapped_string = bVar1;
            mapped_string = (char *)((byte *)mapped_string + 1);
          } while (string < pbVar3);
        }
        uVar5 = element_count;
        if (element_count < mapped_string_capacity) {
          *mapped_string = 0;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

int ON_String::MapStringOrdinal(
  ON_StringMapOrdinalType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (0 != mapped_string_capacity)
  {
    if (nullptr == mapped_string || mapped_string_capacity <= 0)
      return 0;

    if (string != mapped_string)
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0)
      return 0;
    if ( 0 == mapped_string_capacity )
      return element_count+1; // +1 for null terminator
  }
  else if ( 0 == mapped_string_capacity )
    return element_count; // no +1 here

  if ( element_count > mapped_string_capacity )
    return 0;

  char c;
  const char* s1 = string + element_count;
  switch (map_type)
  {
  case ON_StringMapOrdinalType::UpperOrdinal:
  case ON_StringMapOrdinalType::MinimumOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'a' && c <= 'z')
        c -= 0x20;
      *mapped_string++ = c;
    }
    break;

  case ON_StringMapOrdinalType::LowerOrdinal:
    while (string < s1)
    {
      c = *string++;
      if (c >= 'A' && c <= 'Z')
        c += 0x20;
      *mapped_string++ = c;
    }
    break;

  default:
    while (string < s1)
      *mapped_string++ = *string++;
    break;
  }

  if ( element_count < mapped_string_capacity )
    *mapped_string = 0;

  return element_count;
}